

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O2

void add_contains_test(void)

{
  _Bool _Var1;
  array_container_t *arr;
  uint16_t uVar2;
  size_t x;
  ulong uVar3;
  unsigned_long uVar4;
  long lVar5;
  
  arr = array_container_create();
  _assert_true((unsigned_long)arr,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x27);
  uVar2 = 0;
  for (uVar4 = 1; uVar4 != 0x5557; uVar4 = uVar4 + 1) {
    _Var1 = array_container_add(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_add(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x2c);
    _Var1 = array_container_contains(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_contains(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x2d);
    _assert_int_equal((long)arr->cardinality,uVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                      ,0x2e);
    _assert_true((ulong)(arr->cardinality <= arr->capacity),"B->cardinality > B->capacity",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x2f);
    uVar2 = uVar2 + 3;
  }
  for (lVar5 = 0; lVar5 != 0x10000; lVar5 = lVar5 + 1) {
    _Var1 = array_container_contains(arr,(uint16_t)lVar5);
    _assert_int_equal((ulong)_Var1,(ulong)((ushort)((uint16_t)lVar5 % 3) == 0),
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                      ,0x33);
  }
  _assert_int_equal((long)arr->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x36);
  uVar4 = 0x5555;
  for (uVar3 = 0; uVar3 < 0x10000; uVar3 = uVar3 + 3) {
    uVar2 = (uint16_t)uVar3;
    _Var1 = array_container_contains(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_contains(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x39);
    _Var1 = array_container_remove(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_remove(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x3a);
    _assert_int_equal((long)arr->cardinality,uVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                      ,0x3b);
    _Var1 = array_container_contains(arr,uVar2);
    _assert_true((ulong)!_Var1,"array_container_contains(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x3c);
    uVar4 = uVar4 - 1;
  }
  _assert_int_equal((long)arr->cardinality,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x3f);
  uVar2 = 0xffff;
  for (uVar4 = 1; uVar4 != 0x5557; uVar4 = uVar4 + 1) {
    _Var1 = array_container_add(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_add(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x42);
    _Var1 = array_container_contains(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_contains(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x43);
    _assert_int_equal((long)arr->cardinality,uVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                      ,0x44);
    _assert_true((ulong)(arr->cardinality <= arr->capacity),"B->cardinality > B->capacity",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x45);
    uVar2 = uVar2 - 3;
  }
  _assert_int_equal((long)arr->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x48);
  for (lVar5 = 0; lVar5 != 0x10000; lVar5 = lVar5 + 1) {
    _Var1 = array_container_contains(arr,(uint16_t)lVar5);
    _assert_int_equal((ulong)_Var1,(ulong)((ushort)((uint16_t)lVar5 % 3) == 0),
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                      ,0x4b);
  }
  uVar4 = 0x5555;
  for (uVar3 = 0; uVar3 < 0x10000; uVar3 = uVar3 + 3) {
    uVar2 = (uint16_t)uVar3;
    _Var1 = array_container_contains(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_contains(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x4f);
    _Var1 = array_container_remove(arr,uVar2);
    _assert_true((ulong)_Var1,"array_container_remove(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x50);
    _assert_int_equal((long)arr->cardinality,uVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                      ,0x51);
    _Var1 = array_container_contains(arr,uVar2);
    _assert_true((ulong)!_Var1,"array_container_contains(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x52);
    uVar4 = uVar4 - 1;
  }
  array_container_free(arr);
  return;
}

Assistant:

DEFINE_TEST(add_contains_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    int expected_card = 0;

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(array_container_cardinality(B), (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    assert_int_equal(array_container_cardinality(B), 0);

    for (int x = 65535; x >= 0; x -= 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    assert_int_equal(array_container_cardinality(B), expected_card);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    array_container_free(B);
}